

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O1

void test_example_cpp_64(bool copy_on_write)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  _Rb_tree_header *__last;
  bool bVar3;
  ostream *poVar4;
  uint64_t *ans;
  size_t sVar5;
  size_t *psVar6;
  size_t sVar7;
  uint64_t uVar8;
  size_type sVar9;
  fd_set *__writefds;
  char *__format;
  fd_set *__exceptfds;
  timeval *__timeout;
  uint64_t i;
  uint64_t uVar10;
  long lVar11;
  initializer_list<unsigned_long> l;
  anon_class_16_2_3f31b43f __f;
  initializer_list<unsigned_long> l_00;
  uint64_t counter;
  Roaring64Map b;
  const_iterator i_1;
  Roaring64Map r1;
  uint64_t element;
  Roaring64Map r2;
  Roaring64Map r3;
  Roaring64Map t;
  Roaring64Map r1_2_3;
  Roaring64Map r2id;
  Roaring64Map z;
  uint32_t values [3];
  Roaring64Map bigunion;
  Roaring64Map r1f;
  Roaring64Map r2i;
  Roaring64Map i1_2;
  Roaring64Map *allmybitmaps [3];
  uint64_t local_360;
  undefined1 local_358 [12];
  uint uStack_34c;
  _Base_ptr local_348;
  _Base_ptr p_Stack_340;
  _Base_ptr p_Stack_338;
  size_t sStack_330;
  bool local_328;
  undefined1 local_318 [16];
  _Base_ptr local_308;
  _Base_ptr p_Stack_300;
  _Base_ptr local_2f8;
  size_t sStack_2f0;
  bool local_2e8;
  Roaring64Map local_2d8;
  undefined1 local_298 [8];
  Roaring64Map local_290;
  Roaring64Map local_258;
  Roaring64Map local_218;
  Roaring64Map local_1e0;
  Roaring64Map local_1a8;
  Roaring64Map local_170;
  uint32_t local_138 [4];
  Roaring64Map local_128;
  Roaring64Map local_f0;
  Roaring64Map local_b8;
  Roaring64Map local_80;
  Roaring64Map *local_48;
  Roaring64Map *local_40;
  Roaring64Map *local_38;
  
  __last = &local_2d8.roarings._M_t._M_impl.super__Rb_tree_header;
  local_2d8.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2d8.roarings._M_t._M_impl._0_8_ = 0;
  local_2d8.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2d8.roarings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_2d8.roarings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2d8.copyOnWrite = false;
  local_2d8.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &__last->_M_header;
  local_2d8.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &__last->_M_header;
  roaring::Roaring64Map::setCopyOnWrite(&local_2d8,copy_on_write);
  uVar10 = 100;
  do {
    roaring::Roaring64Map::add(&local_2d8,uVar10);
    uVar10 = uVar10 + 1;
  } while (uVar10 != 1000);
  lVar11 = 0;
  do {
    roaring::Roaring64Map::add(&local_2d8,lVar11 + 0xc249fdd327780064);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 900);
  bVar3 = roaring::Roaring64Map::contains(&local_2d8,0xc249fdd3277801f4);
  _assert_true((ulong)bVar3,"r1.contains((uint64_t)14000000000000000500ull)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x21c);
  roaring::Roaring64Map::cardinality(&local_2d8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Cardinality = ",0xe);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  roaring::Roaring64Map::getSizeInBytes(&local_2d8,true);
  roaring::Roaring64Map::runOptimize(&local_2d8);
  roaring::Roaring64Map::getSizeInBytes(&local_2d8,true);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"size before run optimize ",0x19);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," bytes, and after ",0x12);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," bytes.",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  __exceptfds = (fd_set *)0x368d117c00;
  __timeout = (timeval *)0x2d98f13692;
  __format = (char *)0x5;
  sVar9 = 2;
  roaring::Roaring64Map::bitmapOf((Roaring64Map *)(local_298 + 8),5,1);
  roaring::Roaring64Map::printf((Roaring64Map *)(local_298 + 8),__format);
  putchar(10);
  local_1a8.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x368d117c00;
  local_1a8.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x2d98f13692;
  local_1a8.roarings._M_t._M_impl._0_8_ = 1;
  local_1a8.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 2;
  local_1a8.roarings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_1a8.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0xc249fdd327780064;
  l._M_len = sVar9;
  l._M_array = (iterator)0x5;
  roaring::Roaring64Map::bitmapOfList(&local_b8,&local_1a8,l);
  bVar3 = roaring::Roaring64Map::operator==(&local_b8,(Roaring64Map *)(local_298 + 8));
  _assert_true((ulong)bVar3,"r2i == r2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x235);
  local_258.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x368d117c00;
  local_258.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x2d98f13692;
  local_258.roarings._M_t._M_impl._0_8_ = 1;
  local_258.roarings._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = 2;
  local_258.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0xc249fdd327780064;
  l_00._M_len = 5;
  l_00._M_array = (iterator)&local_258;
  roaring::Roaring64Map::Roaring64Map(&local_1a8,l_00);
  bVar3 = roaring::Roaring64Map::operator==(&local_1a8,(Roaring64Map *)(local_298 + 8));
  __writefds = (fd_set *)0x23a;
  _assert_true((ulong)bVar3,"r2id == r2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x23a);
  roaring::Roaring64Map::select
            ((Roaring64Map *)(local_298 + 8),4,(fd_set *)local_298,__writefds,__exceptfds,__timeout)
  ;
  _assert_true((ulong)(local_298 == (undefined1  [8])0xc249fdd327780064),
               "element == 14000000000000000100ull",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x23f);
  uVar10 = roaring::Roaring64Map::minimum((Roaring64Map *)(local_298 + 8));
  _assert_true((ulong)(uVar10 == 1),"r2.minimum() == 1ull",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x241);
  uVar10 = roaring::Roaring64Map::maximum((Roaring64Map *)(local_298 + 8));
  _assert_true((ulong)(uVar10 == 0xc249fdd327780064),"r2.maximum() == 14000000000000000100ull",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x243);
  uVar10 = roaring::Roaring64Map::rank((Roaring64Map *)(local_298 + 8),0x368d117c00);
  _assert_true((ulong)(uVar10 == 4),"r2.rank(234294967296ull) == 4ull",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x245);
  local_138[0] = 2;
  local_138[1] = 3;
  local_138[2] = 4;
  roaring::Roaring64Map::Roaring64Map(&local_258,3,local_138);
  roaring::Roaring64Map::setCopyOnWrite(&local_258,copy_on_write);
  uVar10 = roaring::Roaring64Map::cardinality(&local_2d8);
  ans = (uint64_t *)operator_new__(-(ulong)(uVar10 >> 0x3d != 0) | uVar10 * 8);
  _assert_true(1,"arr1 != NULL",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x24f);
  roaring::Roaring64Map::toUint64Array(&local_2d8,ans);
  roaring::Roaring64Map::Roaring64Map(&local_f0,uVar10,ans);
  operator_delete__(ans);
  bVar3 = roaring::Roaring64Map::operator==(&local_2d8,&local_f0);
  _assert_true((ulong)bVar3,"r1 == r1f",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x255);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
              *)&local_170,
             (_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
              *)&local_258);
  local_170.copyOnWrite = local_258.copyOnWrite;
  roaring::Roaring64Map::setCopyOnWrite(&local_170,copy_on_write);
  bVar3 = roaring::Roaring64Map::operator==(&local_258,&local_170);
  _assert_true((ulong)bVar3,"r3 == z",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x25a);
  roaring::Roaring64Map::operator|(&local_1e0,&local_2d8,(Roaring64Map *)(local_298 + 8));
  roaring::Roaring64Map::setCopyOnWrite(&local_1e0,copy_on_write);
  roaring::Roaring64Map::operator|=(&local_1e0,&local_258);
  local_48 = &local_2d8;
  local_40 = (Roaring64Map *)(local_298 + 8);
  local_38 = &local_258;
  roaring::Roaring64Map::fastunion(&local_128,3,&local_48);
  bVar3 = roaring::Roaring64Map::operator==(&local_1e0,&local_128);
  _assert_true((ulong)bVar3,"r1_2_3 == bigunion",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x264);
  roaring::Roaring64Map::operator&(&local_80,&local_2d8,(Roaring64Map *)(local_298 + 8));
  sVar5 = roaring::Roaring64Map::getSizeInBytes(&local_2d8,true);
  psVar6 = (size_t *)operator_new__(sVar5);
  *psVar6 = local_2d8.roarings._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_218.roarings._M_t._M_impl._0_8_ = psVar6 + 1;
  __f._8_8_ = 1;
  __f.buf = (char **)&local_218;
  std::
  for_each<std::_Rb_tree_const_iterator<std::pair<unsigned_int_const,roaring::Roaring>>,roaring::Roaring64Map::write(char*,bool)const::_lambda(std::pair<unsigned_int_const,roaring::Roaring>const&)_1_>
            ((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>)
             local_2d8.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>)__last,__f);
  roaring::Roaring64Map::read((int)&local_218,psVar6,1);
  sVar7 = roaring::Roaring64Map::getSizeInBytes(&local_218,true);
  _assert_true((ulong)(sVar5 == sVar7),"expectedsize == t.getSizeInBytes()",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x26e);
  bVar3 = roaring::Roaring64Map::operator==(&local_2d8,&local_218);
  _assert_true((ulong)bVar3,"r1 == t",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x26f);
  operator_delete__(psVar6);
  local_360 = 0;
  roaring::Roaring64Map::iterate(&local_2d8,roaring_iterator_sumall64,&local_360);
  local_360 = 0;
  roaring::Roaring64MapSetBitBiDirectionalIterator::Roaring64MapSetBitBiDirectionalIterator
            ((Roaring64MapSetBitBiDirectionalIterator *)local_318,&local_218,false);
  if ((_Rb_tree_header *)local_318._8_8_ !=
      &(((_Rep_type *)local_318._0_8_)->_M_impl).super__Rb_tree_header) {
    do {
      local_360 = local_360 + 1;
      roaring::Roaring64MapSetBitBiDirectionalIterator::operator++
                ((type_of_iterator *)local_358,(Roaring64MapSetBitBiDirectionalIterator *)local_318,
                 0);
    } while ((_Rb_tree_header *)local_318._8_8_ !=
             &(((_Rep_type *)local_318._0_8_)->_M_impl).super__Rb_tree_header);
  }
  uVar10 = local_360;
  uVar8 = roaring::Roaring64Map::cardinality(&local_218);
  _assert_true((ulong)(uVar10 == uVar8),"counter == t.cardinality()",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x280);
  p_Var1 = (_Base_ptr)(local_318 + 8);
  local_308 = (_Base_ptr)0x0;
  local_318._0_8_ =
       (map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
        *)0x0;
  local_318._8_8_ = (_Base_ptr)0x0;
  sStack_2f0 = 0;
  local_2e8 = false;
  p_Stack_300 = p_Var1;
  local_2f8 = p_Var1;
  roaring::Roaring64Map::add((Roaring64Map *)local_318,1);
  roaring::Roaring64Map::add((Roaring64Map *)local_318,2);
  roaring::Roaring64Map::add((Roaring64Map *)local_318,3);
  uVar10 = roaring::Roaring64Map::cardinality((Roaring64Map *)local_318);
  _assert_int_equal(3,uVar10,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
                    ,0x287);
  p_Var2 = (_Base_ptr)(local_358 + 8);
  if (local_308 == (_Base_ptr)0x0) {
    psVar6 = &sStack_330;
    stack0xfffffffffffffcb0 = (_Base_ptr)((ulong)uStack_34c << 0x20);
    local_348 = (_Base_ptr)0x0;
    p_Stack_340 = p_Var2;
    p_Stack_338 = p_Var2;
  }
  else {
    psVar6 = &sStack_2f0;
    local_358._8_4_ = local_318._8_4_;
    local_348 = local_308;
    p_Stack_340 = p_Stack_300;
    p_Stack_338 = local_2f8;
    local_308->_M_parent = p_Var2;
    sStack_330 = sStack_2f0;
    local_308 = (_Base_ptr)0x0;
    p_Stack_300 = p_Var1;
    local_2f8 = p_Var1;
  }
  *psVar6 = 0;
  local_328 = local_2e8;
  uVar10 = roaring::Roaring64Map::cardinality((Roaring64Map *)local_358);
  _assert_int_equal(3,uVar10,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
                    ,0x28a);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)local_358);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)local_318);
  local_308 = (_Base_ptr)0x0;
  local_318._0_8_ =
       (map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
        *)0x0;
  local_318._8_8_ = (_Base_ptr)0x0;
  sStack_2f0 = 0;
  local_2e8 = false;
  local_348 = (_Base_ptr)0x0;
  local_358._0_8_ =
       (map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
        *)0x0;
  stack0xfffffffffffffcb0 = (_Base_ptr)0x0;
  sStack_330 = 0;
  local_328 = false;
  p_Stack_340 = p_Var2;
  p_Stack_338 = p_Var2;
  p_Stack_300 = p_Var1;
  local_2f8 = p_Var1;
  roaring::Roaring64Map::add((Roaring64Map *)local_358,1);
  roaring::Roaring64Map::add((Roaring64Map *)local_358,2);
  roaring::Roaring64Map::add((Roaring64Map *)local_358,3);
  uVar10 = roaring::Roaring64Map::cardinality((Roaring64Map *)local_358);
  _assert_int_equal(3,uVar10,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
                    ,0x293);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::clear((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
           *)local_318);
  if (local_348 != (_Base_ptr)0x0) {
    local_318._8_4_ = local_358._8_4_;
    local_308 = local_348;
    p_Stack_300 = p_Stack_340;
    local_2f8 = p_Stack_338;
    local_348->_M_parent = p_Var1;
    sStack_2f0 = sStack_330;
    local_348 = (_Base_ptr)0x0;
    sStack_330 = 0;
    p_Stack_340 = p_Var2;
    p_Stack_338 = p_Var2;
  }
  local_2e8 = local_328;
  uVar10 = roaring::Roaring64Map::cardinality((Roaring64Map *)local_318);
  _assert_int_equal(3,uVar10,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
                    ,0x296);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)local_358);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)local_318);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&local_218);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&local_80);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&local_128);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&local_1e0);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&local_170);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&local_f0);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&local_258);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&local_1a8);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&local_b8);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)(local_298 + 8));
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&local_2d8);
  return;
}

Assistant:

void test_example_cpp_64(bool copy_on_write) {
    // create a new empty bitmap
    Roaring64Map r1;
    r1.setCopyOnWrite(copy_on_write);
    // then we can add values
    for (uint64_t i = 100; i < 1000; i++) {
        r1.add(i);
    }
    for (uint64_t i = 14000000000000000100ull; i < 14000000000000001000ull;
         i++) {
        r1.add(i);
    }

    // check whether a value is contained
    assert_true(r1.contains((uint64_t)14000000000000000500ull));

    // compute how many bits there are:
    uint64_t cardinality = r1.cardinality();
    std::cout << "Cardinality = " << cardinality << std::endl;

    // if your bitmaps have long runs, you can compress them by calling
    // run_optimize
    uint64_t size = r1.getSizeInBytes();
    r1.runOptimize();
    uint64_t compact_size = r1.getSizeInBytes();

    std::cout << "size before run optimize " << size << " bytes, and after "
              << compact_size << " bytes." << std::endl;

    // create a new bitmap with varargs
    Roaring64Map r2 =
        Roaring64Map::bitmapOf(5, 1ull, 2ull, 234294967296ull, 195839473298ull,
                               14000000000000000100ull);

    r2.printf();
    printf("\n");
    // create a new bitmap with initializer list
    Roaring64Map r2i = Roaring64Map::bitmapOfList(
        {1, 2, 234294967296, 195839473298, 14000000000000000100ull});
    assert_true(r2i == r2);

    // create a new bitmap directly from initializer list
    Roaring64Map r2id = {1, 2, 234294967296, 195839473298,
                         14000000000000000100ull};
    assert_true(r2id == r2);

    // test select
    uint64_t element;
    r2.select(4, &element);
    assert_true(element == 14000000000000000100ull);

    assert_true(r2.minimum() == 1ull);

    assert_true(r2.maximum() == 14000000000000000100ull);

    assert_true(r2.rank(234294967296ull) == 4ull);

    // we can also create a bitmap from a pointer to 32-bit integers
    const uint32_t values[] = {2, 3, 4};
    Roaring64Map r3(3, values);
    r3.setCopyOnWrite(copy_on_write);

    // we can also go in reverse and go from arrays to bitmaps
    uint64_t card1 = r1.cardinality();
    uint64_t *arr1 = new uint64_t[card1];
    assert_true(arr1 != NULL);
    r1.toUint64Array(arr1);
    Roaring64Map r1f(card1, arr1);
    delete[] arr1;

    // bitmaps shall be equal
    assert_true(r1 == r1f);

    // we can copy and compare bitmaps
    Roaring64Map z(r3);
    z.setCopyOnWrite(copy_on_write);
    assert_true(r3 == z);

    // we can compute union two-by-two
    Roaring64Map r1_2_3 = r1 | r2;
    r1_2_3.setCopyOnWrite(copy_on_write);
    r1_2_3 |= r3;

    // we can compute a big union
    const Roaring64Map *allmybitmaps[] = {&r1, &r2, &r3};
    Roaring64Map bigunion = Roaring64Map::fastunion(3, allmybitmaps);
    assert_true(r1_2_3 == bigunion);

    // we can compute intersection two-by-two
    Roaring64Map i1_2 = r1 & r2;

    // we can write a bitmap to a pointer and recover it later
    size_t expectedsize = r1.getSizeInBytes();
    char *serializedbytes = new char[expectedsize];
    r1.write(serializedbytes);
    Roaring64Map t = Roaring64Map::read(serializedbytes);
    assert_true(expectedsize == t.getSizeInBytes());
    assert_true(r1 == t);
    delete[] serializedbytes;

    // we can iterate over all values using custom functions
    uint64_t counter = 0;
    r1.iterate(roaring_iterator_sumall64, &counter);
    /**
     * void roaring_iterator_sumall64(uint64_t value, void *param) {
     *        *(uint64_t *) param += value;
     *  }
     *
     */
    // we can also iterate the C++ way
    counter = 0;
    for (Roaring64Map::const_iterator i = t.begin(); i != t.end(); i++) {
        ++counter;
    }
    assert_true(counter == t.cardinality());

    {
        Roaring64Map b;
        b.add(1u);
        b.add(2u);
        b.add(3u);
        assert_int_equal(3, b.cardinality());

        Roaring64Map a(std::move(b));
        assert_int_equal(3, a.cardinality());
        // assert_int_equal(0, b.cardinality()); // no: b is now unspecified.
    }

    {
        Roaring64Map a, b;
        b.add(1u);
        b.add(2u);
        b.add(3u);
        assert_int_equal(3, b.cardinality());

        a = std::move(b);
        assert_int_equal(3, a.cardinality());
        // assert_int_equal(0, b.cardinality()); // no: b is unspecified
    }
}